

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O0

void c4mat_print_some(int m,int n,complex<float> *a,int ilo,int jlo,int ihi,int jhi,string *title)

{
  int iVar1;
  _Setw _Var2;
  int iVar3;
  ostream *poVar4;
  float fVar5;
  int local_50;
  int j2lo;
  int j2hi;
  int j2;
  int j;
  int incx;
  int inc;
  int i2lo;
  int i2hi;
  int i;
  complex<float> c;
  int ihi_local;
  int jlo_local;
  int ilo_local;
  complex<float> *a_local;
  int n_local;
  int m_local;
  
  c._M_value._0_4_ = ihi;
  c._M_value._4_4_ = jlo;
  std::complex<float>::complex((complex<float> *)&i2hi,0.0,0.0);
  std::operator<<((ostream *)&std::cout,"\n");
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)title);
  std::operator<<(poVar4,"\n");
  if ((m < 1) || (n < 1)) {
    std::operator<<((ostream *)&std::cout,"\n");
    std::operator<<((ostream *)&std::cout,"  (None)\n");
  }
  else {
    for (local_50 = c._M_value._4_4_; iVar1 = i4_min(jhi,n), local_50 <= iVar1;
        local_50 = local_50 + 4) {
      iVar1 = i4_min(local_50 + 3,n);
      iVar1 = i4_min(iVar1,jhi);
      std::operator<<((ostream *)&std::cout,"\n");
      std::operator<<((ostream *)&std::cout,"  Col: ");
      for (j2hi = local_50; j2hi <= iVar1; j2hi = j2hi + 1) {
        poVar4 = std::operator<<((ostream *)&std::cout,"     ");
        _Var2 = std::setw(10);
        poVar4 = std::operator<<(poVar4,_Var2);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,j2hi);
        std::operator<<(poVar4,"     ");
      }
      std::operator<<((ostream *)&std::cout,"\n");
      std::operator<<((ostream *)&std::cout,"  Row\n");
      std::operator<<((ostream *)&std::cout,"  ---\n");
      i2lo = i4_max(ilo,1);
      iVar3 = i4_min((int)c._M_value,m);
      for (; i2lo <= iVar3; i2lo = i2lo + 1) {
        _Var2 = std::setw(5);
        poVar4 = std::operator<<((ostream *)&std::cout,_Var2);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,i2lo);
        std::operator<<(poVar4,":");
        for (j2lo = 1; j2lo <= (iVar1 + 1) - local_50; j2lo = j2lo + 1) {
          _i2hi = a[i2lo + -1 + (local_50 + j2lo + -2) * m]._M_value;
          poVar4 = std::operator<<((ostream *)&std::cout,"  ");
          _Var2 = std::setw(8);
          poVar4 = std::operator<<(poVar4,_Var2);
          fVar5 = std::real<float>((complex<float> *)&i2hi);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,fVar5);
          poVar4 = std::operator<<(poVar4,"  ");
          _Var2 = std::setw(8);
          poVar4 = std::operator<<(poVar4,_Var2);
          fVar5 = std::imag<float>((complex<float> *)&i2hi);
          std::ostream::operator<<(poVar4,fVar5);
        }
        std::operator<<((ostream *)&std::cout,"\n");
      }
    }
  }
  return;
}

Assistant:

void c4mat_print_some ( int m, int n, complex <float> a[], int ilo, int jlo, 
  int ihi, int jhi, string title )

//****************************************************************************80
//
//  Purpose:
//
//    C4MAT_PRINT_SOME prints some of a C4MAT.
//
//  Discussion:
//
//    A C4MAT is an array of complex <float> values.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    20 April 2008
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, N, the number of rows and columns in the matrix.
//
//    Input, complex <float> A[M*N], the matrix.
//
//    Input, int ILO, JLO, IHI, JHI, the first row and
//    column, and the last row and column to be printed.
//
//    Input, string TITLE, a title.
//
{
  complex <float> c;
  int i;
  int i2hi;
  int i2lo;
  int inc;
  int incx = 4;
  int j;
  int j2;
  int j2hi;
  int j2lo;

  cout << "\n";
  cout << title << "\n";

  if ( m <= 0 || n <= 0 )
  {
    cout << "\n";
    cout << "  (None)\n";
    return;
  }
//
//  Print the columns of the matrix, in strips of INCX.
//
  for ( j2lo = jlo; j2lo <= i4_min ( jhi, n ); j2lo = j2lo + incx )
  {
    j2hi = j2lo + incx - 1;
    j2hi = i4_min ( j2hi, n );
    j2hi = i4_min ( j2hi, jhi );

    inc = j2hi + 1 - j2lo;

    cout << "\n";
    cout << "  Col: ";
    for ( j = j2lo; j <= j2hi; j++ )
    {
      j2 = j + 1 - j2lo;
      cout << "     " << setw(10) << j << "     ";
    }
    cout << "\n";
    cout << "  Row\n";
    cout << "  ---\n";
//
//  Determine the range of the rows in this strip.
//
    i2lo = i4_max ( ilo, 1 );
    i2hi = i4_min ( ihi, m );

    for ( i = i2lo; i <= i2hi; i++ )
    {
      cout << setw(5) << i << ":";
//
//  Print out (up to) INCX entries in row I, that lie in the current strip.
//
      for ( j2 = 1; j2 <= inc; j2++ )
      {
        j = j2lo - 1 + j2;
        c = a[i-1+(j-1)*m];
        cout << "  " << setw(8) << real ( c )
             << "  " << setw(8) << imag ( c );
      }
      cout << "\n";
    }
  }

  return;
}